

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.cxx
# Opt level: O1

int __thiscall Fl_Widget::damage_resize(Fl_Widget *this,int X,int Y,int W,int H)

{
  int iVar1;
  
  if ((((this->x_ != X) || (this->y_ != Y)) || (this->w_ != W)) || (iVar1 = 0, this->h_ != H)) {
    (*this->_vptr_Fl_Widget[4])(this);
    redraw(this);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Fl_Widget::damage_resize(int X, int Y, int W, int H) {
  if (x() == X && y() == Y && w() == W && h() == H) return 0;
  resize(X, Y, W, H);
  redraw();
  return 1;
}